

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHessian_ASA_FSA.c
# Opt level: O0

int rhsQBS1(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector *yyS,N_Vector *ypS,N_Vector yyB,
           N_Vector ypB,N_Vector rhsBQS,void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  sunrealtype l21;
  sunrealtype s3;
  sunrealtype s2;
  sunrealtype s1;
  sunrealtype m2;
  sunrealtype m1;
  sunrealtype l2;
  sunrealtype l1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  N_Vector ypB_local;
  N_Vector yyB_local;
  N_Vector *ypS_local;
  N_Vector *yyS_local;
  N_Vector yp_local;
  
  dVar1 = **(double **)((long)yy->content + 0x10);
  dVar2 = *(double *)(*(long *)((long)yy->content + 0x10) + 8);
  dVar3 = *(double *)(*(long *)((long)yy->content + 0x10) + 0x10);
  dVar4 = *(double *)(*(long *)((long)yyB->content + 0x10) + 0x18);
  dVar5 = *(double *)(*(long *)((long)yyB->content + 0x10) + 0x20);
  dVar6 = **(double **)((long)(*yyS)->content + 0x10);
  dVar7 = *(double *)(*(long *)((long)(*yyS)->content + 0x10) + 8);
  dVar8 = *(double *)(*(long *)((long)(*yyS)->content + 0x10) + 0x10);
  dVar9 = *(double *)(*(long *)((long)yyB->content + 0x10) + 8) -
          **(double **)((long)yyB->content + 0x10);
  **(double **)((long)rhsBQS->content + 0x10) = -dVar1 * dVar9;
  *(double *)(*(long *)((long)rhsBQS->content + 0x10) + 8) = dVar2 * dVar3 * dVar9;
  *(double *)(*(long *)((long)rhsBQS->content + 0x10) + 0x10) =
       dVar1 * (dVar4 - dVar5) + -(dVar6 * dVar9);
  *(double *)(*(long *)((long)rhsBQS->content + 0x10) + 0x18) =
       dVar2 * dVar3 * (dVar5 - dVar4) + (dVar3 * dVar7 + dVar2 * dVar8) * dVar9;
  return 0;
}

Assistant:

static int rhsQBS1(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector* yyS,
                   N_Vector* ypS, N_Vector yyB, N_Vector ypB, N_Vector rhsBQS,
                   void* user_dataB)
{
  sunrealtype y1, y2, y3;
  sunrealtype l1, l2, m1, m2;
  sunrealtype s1, s2, s3;
  sunrealtype l21;

  /* The y vector */
  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  /* The lambda vector. */
  l1 = Ith(yyB, 1);
  l2 = Ith(yyB, 2);

  /* The mu vector. */
  m1 = Ith(yyB, 4);
  m2 = Ith(yyB, 5);

  /* The sensitivity with respect to p1 */
  s1 = Ith(yyS[0], 1);
  s2 = Ith(yyS[0], 2);
  s3 = Ith(yyS[0], 3);

  /* Temporary variables */
  l21 = l2 - l1;

  Ith(rhsBQS, 1) = -y1 * l21;
  Ith(rhsBQS, 2) = y2 * y3 * l21;

  Ith(rhsBQS, 3) = y1 * (m1 - m2) - s1 * l21;
  Ith(rhsBQS, 4) = y2 * y3 * (m2 - m1) + (y3 * s2 + y2 * s3) * l21;

  return (0);
}